

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.cpp
# Opt level: O0

int __thiscall dlib::directory::init(directory *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  undefined8 uVar5;
  long lVar6;
  dir_not_found *this_00;
  string *psVar7;
  stat64 buffer;
  size_type pos;
  char sep;
  char buf [4096];
  string *in_stack_ffffffffffffee78;
  string *in_stack_ffffffffffffee80;
  directory *in_stack_ffffffffffffee88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeec0;
  char *in_stack_ffffffffffffeec8;
  stat64 local_1100;
  string local_1070 [32];
  undefined8 local_1050;
  char local_1046;
  undefined1 local_1045;
  char local_1018 [4104];
  EVP_PKEY_CTX *local_10;
  directory *local_8;
  
  local_10 = ctx;
  local_8 = this;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  pcVar4 = realpath(pcVar4,local_1018);
  if (pcVar4 == (char *)0x0) {
    local_1045 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    std::operator+(in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0);
    dir_not_found::dir_not_found
              ((dir_not_found *)in_stack_ffffffffffffee80,in_stack_ffffffffffffee78);
    local_1045 = 0;
    __cxa_throw(uVar5,&dir_not_found::typeinfo,dir_not_found::~dir_not_found);
  }
  std::__cxx11::string::operator=((string *)&(this->state).full_name,local_1018);
  local_1046 = get_separator();
  bVar1 = is_root_path(in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
  if (bVar1) {
    psVar7 = &(this->state).full_name;
    std::__cxx11::string::size();
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psVar7);
    if (*pcVar4 != local_1046) {
      std::__cxx11::string::operator+=((string *)&(this->state).full_name,local_1046);
    }
  }
  else {
    std::__cxx11::string::size();
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&(this->state).full_name);
    if (*pcVar4 == local_1046) {
      lVar6 = std::__cxx11::string::size();
      std::__cxx11::string::erase((ulong)&(this->state).full_name,lVar6 - 1);
    }
    local_1050 = std::__cxx11::string::find_last_of((char)this + ' ',(ulong)(uint)(int)local_1046);
    std::__cxx11::string::substr((ulong)local_1070,(ulong)&(this->state).full_name);
    std::__cxx11::string::operator=((string *)this,local_1070);
    std::__cxx11::string::~string(local_1070);
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = stat64(pcVar4,&local_1100);
  if (iVar2 == 0) {
    uVar3 = (uint)((local_1100.st_mode & 0xf000) == 0x4000);
    if (uVar3 != 0) {
      return uVar3;
    }
    psVar7 = (string *)__cxa_allocate_exception(0x30);
    std::operator+(in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0);
    dir_not_found::dir_not_found((dir_not_found *)in_stack_ffffffffffffee80,psVar7);
    __cxa_throw(psVar7,&dir_not_found::typeinfo,dir_not_found::~dir_not_found);
  }
  this_00 = (dir_not_found *)__cxa_allocate_exception(0x30);
  std::operator+(in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0);
  dir_not_found::dir_not_found(this_00,in_stack_ffffffffffffee78);
  __cxa_throw(this_00,&dir_not_found::typeinfo,dir_not_found::~dir_not_found);
}

Assistant:

void directory::
    init (
        const std::string& name
    )
    {
        using namespace std;

        
        char buf[PATH_MAX];
        if (realpath(name.c_str(),buf) == 0)
        {
            // the directory was not found
            throw dir_not_found("Unable to find directory " + name);
        }
        state.full_name = buf;
  
        
        const char sep = get_separator();
        if (is_root_path(state.full_name) == false)
        {
            // ensure that thre is not a trialing separator
            if (state.full_name[state.full_name.size()-1] == sep)
                state.full_name.erase(state.full_name.size()-1);

            // pick out the directory name
            string::size_type pos = state.full_name.find_last_of(sep);
            state.name = state.full_name.substr(pos+1);
        }
        else
        {
            // ensure that there is a trailing separator
            if (state.full_name[state.full_name.size()-1] != sep)
                state.full_name += sep;
        }


        struct stat64 buffer;
        // now check that this is actually a valid directory
        if (::stat64(state.full_name.c_str(),&buffer))
        {
            // the directory was not found
            throw dir_not_found("Unable to find directory " + name);
        }
        else if (S_ISDIR(buffer.st_mode) == 0)
        {
            // It is not a directory
            throw dir_not_found("Unable to find directory " + name);
        }
    }